

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void FSE_initCState2(FSE_CState_t *statePtr,FSE_CTable *ct,U32 symbol)

{
  uint uVar1;
  int iVar2;
  
  FSE_initCState(statePtr,ct);
  iVar2 = *(int *)((long)statePtr->symbolTT + (ulong)symbol * 8 + 4);
  uVar1 = iVar2 + 0x8000;
  statePtr->value =
       (ulong)*(ushort *)
               ((long)statePtr->stateTable +
               (long)*(int *)((long)statePtr->symbolTT + (ulong)symbol * 8) * 2 +
               (ulong)((uVar1 & 0xffff0000) - iVar2 >> ((byte)(uVar1 >> 0x10) & 0x3f)) * 2);
  return;
}

Assistant:

MEM_STATIC void FSE_initCState2(FSE_CState_t* statePtr, const FSE_CTable* ct, U32 symbol)
{
    FSE_initCState(statePtr, ct);
    {   const FSE_symbolCompressionTransform symbolTT = ((const FSE_symbolCompressionTransform*)(statePtr->symbolTT))[symbol];
        const U16* stateTable = (const U16*)(statePtr->stateTable);
        U32 nbBitsOut  = (U32)((symbolTT.deltaNbBits + (1<<15)) >> 16);
        statePtr->value = (nbBitsOut << 16) - symbolTT.deltaNbBits;
        statePtr->value = stateTable[(statePtr->value >> nbBitsOut) + symbolTT.deltaFindState];
    }
}